

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseBuilder::embedLabel(BaseBuilder *this,Label *label,size_t dataSize)

{
  bool bVar1;
  BaseBuilder *in_RDX;
  long in_RSI;
  long in_RDI;
  Error _err;
  EmbedLabelNode *node;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Error in_stack_ffffffffffffffcc;
  BaseEmitter *in_stack_ffffffffffffffd0;
  Error local_c;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    local_c = DebugUtils::errored(5);
  }
  else {
    bVar1 = BaseBuilder_checkDataSize((size_t)in_RDX);
    if (bVar1) {
      local_c = _newNodeT<asmjit::v1_14::EmbedLabelNode,unsigned_int,unsigned_int>
                          (in_RDX,(EmbedLabelNode **)in_stack_ffffffffffffffd0,
                           (uint *)CONCAT44(in_stack_ffffffffffffffcc,*(undefined4 *)(in_RSI + 4)),
                           (uint *)CONCAT44((int)in_RDX,in_stack_ffffffffffffffc0));
      if (local_c == 0) {
        addNode(in_RDX,(BaseNode *)in_stack_ffffffffffffffd0);
        local_c = 0;
      }
    }
    else {
      DebugUtils::errored(2);
      local_c = BaseEmitter::reportError
                          (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                           (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
  }
  return local_c;
}

Assistant:

Error BaseBuilder::embedLabel(const Label& label, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (!BaseBuilder_checkDataSize(dataSize))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  EmbedLabelNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedLabelNode>(&node, label.id(), uint32_t(dataSize)));

  addNode(node);
  return kErrorOk;
}